

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall fasttext::Dictionary::prune(Dictionary *this,vector<int,_std::allocator<int>_> *idx)

{
  pointer peVar1;
  pointer piVar2;
  entry_type eVar3;
  int32_t iVar4;
  const_iterator __cbeg;
  mapped_type *pmVar5;
  pointer peVar6;
  pointer *ppiVar7;
  ulong uVar8;
  long lVar9;
  pointer piVar10;
  iterator __position;
  vector<int,std::allocator<int>> *pvVar11;
  iterator __begin2;
  int *piVar12;
  int32_t j;
  int iVar13;
  long lVar14;
  pointer piVar15;
  ulong uVar16;
  vector<int,_std::allocator<int>_> words;
  vector<int,_std::allocator<int>_> ngrams;
  vector<int,_std::allocator<int>_> local_88;
  int *local_68;
  pointer piStack_60;
  int *local_58;
  vector<int,std::allocator<int>> *local_48;
  int local_3c;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *local_38;
  
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_58 = (int *)0x0;
  local_68 = (int *)0x0;
  piStack_60 = (int *)0x0;
  piVar15 = (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if (piVar15 !=
      (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
     ) {
    do {
      if (*piVar15 < this->nwords_) {
        ppiVar7 = &local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        __position._M_current =
             local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        piVar10 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pvVar11 = (vector<int,std::allocator<int>> *)&local_88;
        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) goto LAB_00126704;
LAB_001266e5:
        *piVar10 = *piVar15;
        *ppiVar7 = piVar10 + 1;
      }
      else {
        ppiVar7 = &piStack_60;
        __position._M_current = piStack_60;
        piVar10 = piStack_60;
        pvVar11 = (vector<int,std::allocator<int>> *)&local_68;
        if (piStack_60 != local_58) goto LAB_001266e5;
LAB_00126704:
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (pvVar11,__position,piVar15);
      }
      piVar2 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar10 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar15 = piVar15 + 1;
    } while (piVar15 !=
             (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish);
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (int)LZCOUNT((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar10,piVar2);
    }
  }
  std::vector<int,_std::allocator<int>_>::operator=(idx,&local_88);
  piVar15 = piStack_60;
  if (piStack_60 != local_68) {
    iVar13 = 0;
    piVar12 = local_68;
    local_48 = (vector<int,std::allocator<int>> *)idx;
    do {
      local_3c = *piVar12 - this->nwords_;
      pmVar5 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->pruneidx_,&local_3c);
      *pmVar5 = iVar13;
      iVar13 = iVar13 + 1;
      piVar12 = piVar12 + 1;
    } while (piVar12 != piVar15);
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_48,*(undefined8 *)(local_48 + 8),local_68,piStack_60);
  }
  this->pruneidx_size_ = (this->pruneidx_)._M_h._M_element_count;
  piVar15 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar10 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (piVar15 != piVar10) {
    memset(piVar15,0xff,((long)piVar10 + (-4 - (long)piVar15) & 0xfffffffffffffffcU) + 4);
  }
  local_38 = &this->words_;
  peVar6 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pvVar11 = (vector<int,std::allocator<int>> *)0x0;
  if ((this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
      super__Vector_impl_data._M_finish == peVar6) {
    lVar9 = 0;
  }
  else {
    lVar14 = 0x30;
    uVar16 = 0;
    do {
      eVar3 = getType(this,(int32_t)uVar16);
      uVar8 = (ulong)(int)pvVar11;
      if ((eVar3 == label) ||
         ((uVar8 < (ulong)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2) &&
          (uVar16 == (uint)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar8])))) {
        peVar1 = (local_38->super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        peVar6 = peVar1 + uVar8;
        local_48 = pvVar11;
        std::__cxx11::string::_M_assign((string *)peVar6);
        peVar6->type = *(entry_type *)((long)peVar1 + lVar14 + -8);
        peVar6->count = *(int64_t *)((long)peVar1 + lVar14 + -0x10);
        std::vector<int,_std::allocator<int>_>::operator=
                  (&peVar6->subwords,
                   (vector<int,_std::allocator<int>_> *)
                   ((long)&(peVar1->word)._M_dataplus._M_p + lVar14));
        iVar4 = find(this,&(this->words_).
                           super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar8].word);
        (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4] = (int)local_48;
        pvVar11 = (vector<int,std::allocator<int>> *)(ulong)((int)local_48 + 1);
      }
      uVar16 = uVar16 + 1;
      peVar6 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar9 = (long)(this->words_).
                    super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)peVar6;
      uVar8 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
      lVar14 = lVar14 + 0x48;
    } while (uVar16 <= uVar8 && uVar8 - uVar16 != 0);
  }
  iVar13 = (int)((ulong)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  this->nwords_ = iVar13;
  lVar14 = (long)iVar13 + (long)this->nlabels_;
  this->size_ = (int32_t)lVar14;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::_M_erase
            (local_38,peVar6 + lVar14,(entry *)((long)&(peVar6->word)._M_dataplus._M_p + lVar9));
  initNgrams(this);
  if (local_68 != (int *)0x0) {
    operator_delete(local_68);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Dictionary::prune(std::vector<int32_t>& idx) {
  std::vector<int32_t> words, ngrams;
  for (auto it = idx.cbegin(); it != idx.cend(); ++it) {
    if (*it < nwords_) {
      words.push_back(*it);
    } else {
      ngrams.push_back(*it);
    }
  }
  std::sort(words.begin(), words.end());
  idx = words;

  if (ngrams.size() != 0) {
    int32_t j = 0;
    for (const auto ngram : ngrams) {
      pruneidx_[ngram - nwords_] = j;
      j++;
    }
    idx.insert(idx.end(), ngrams.begin(), ngrams.end());
  }
  pruneidx_size_ = pruneidx_.size();

  std::fill(word2int_.begin(), word2int_.end(), -1);

  int32_t j = 0;
  for (int32_t i = 0; i < words_.size(); i++) {
    if (getType(i) == entry_type::label ||
        (j < words.size() && words[j] == i)) {
      words_[j] = words_[i];
      word2int_[find(words_[j].word)] = j;
      j++;
    }
  }
  nwords_ = words.size();
  size_ = nwords_ + nlabels_;
  words_.erase(words_.begin() + size_, words_.end());
  initNgrams();
}